

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O1

void place_gold(chunk_conflict *c,loc_conflict grid,wchar_t level,uint8_t origin)

{
  _Bool _Var1;
  uint8_t uVar2;
  _Bool dummy;
  object *money;
  _Bool local_29;
  object *local_28;
  
  local_28 = (object *)0x0;
  local_29 = true;
  _Var1 = square_in_bounds(c,(loc)grid);
  if (_Var1) {
    _Var1 = square_canputitem(c,(loc)grid);
    if (_Var1) {
      local_28 = make_gold(level,"any");
      local_28->origin = origin;
      uVar2 = convert_depth_to_origin(level);
      local_28->origin_depth = uVar2;
      _Var1 = floor_carry((chunk *)c,(loc)grid,local_28,&local_29);
      if (_Var1) {
        list_object(c,local_28);
      }
      else {
        object_delete((chunk *)c,(chunk *)0x0,&local_28);
      }
    }
  }
  return;
}

Assistant:

void place_gold(struct chunk *c, struct loc grid, int level, uint8_t origin)
{
	struct object *money = NULL;
	bool dummy = true;

	if (!square_in_bounds(c, grid)) return;
	if (!square_canputitem(c, grid)) return;

	money = make_gold(level, "any");
	money->origin = origin;
	money->origin_depth = convert_depth_to_origin(level);

	if (!floor_carry(c, grid, money, &dummy)) {
		object_delete(c, NULL, &money);
	} else {
		list_object(c, money);
	}
}